

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

void bitset_set_to_value(bitset_t *bitset,size_t i,_Bool flag)

{
  _Bool _Var1;
  ulong uVar2;
  bitset_t *bitset_00;
  size_t newarraysize;
  byte in_DL;
  ulong in_RSI;
  long *in_RDI;
  uint64_t w;
  uint64_t dynmask;
  uint64_t mask;
  size_t shiftedi;
  
  uVar2 = in_RSI >> 6;
  bitset_00 = (bitset_t *)(1L << ((byte)in_RSI & 0x3f));
  newarraysize = (ulong)(in_DL & 1) << ((byte)in_RSI & 0x3f);
  if ((uVar2 < (ulong)in_RDI[1]) || (_Var1 = bitset_grow(bitset_00,newarraysize), _Var1)) {
    *(size_t *)(*in_RDI + uVar2 * 8) =
         newarraysize | ((ulong)bitset_00 ^ 0xffffffffffffffff) & *(ulong *)(*in_RDI + uVar2 * 8);
  }
  return;
}

Assistant:

inline void bitset_set_to_value(bitset_t *bitset, size_t i, bool flag) {
    size_t shiftedi = i / 64;
    uint64_t mask = ((uint64_t)1) << (i % 64);
    uint64_t dynmask = ((uint64_t)flag) << (i % 64);
    if (shiftedi >= bitset->arraysize) {
        if (!bitset_grow(bitset, shiftedi + 1)) {
            return;
        }
    }
    uint64_t w = bitset->array[shiftedi];
    w &= ~mask;
    w |= dynmask;
    bitset->array[shiftedi] = w;
}